

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hpp
# Opt level: O2

void __thiscall
nestl::test::allocator_with_state<nestl::impl::detail::rb_tree_node<int>_>::deallocate
          (allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *this,rb_tree_node<int> *p,
          size_t param_2)

{
  rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
  *prVar1;
  iterator position;
  element_type *peVar2;
  rb_tree_node<int> *local_20;
  
  prVar1 = &impl::
            shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
            operator->(&this->m_allocated_storage)->m_impl;
  local_20 = p;
  position = impl::detail::
             rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
             ::find(prVar1,&local_20);
  peVar2 = impl::shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
           ::operator->(&this->m_allocated_storage);
  if (position.m_node == &(peVar2->m_impl).m_impl.m_header) {
    if (p != (rb_tree_node<int> *)0x0) {
      local_20 = p;
      fatal_failure<char_const(&)[10],void*,char_const(&)[36]>
                ((char (*) [10])"pointer [",&local_20,
                 (char (*) [36])"] does not belong to this allocator");
    }
  }
  else {
    prVar1 = &impl::
              shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
              operator->(&this->m_allocated_storage)->m_impl;
    impl::detail::
    rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
    ::erase(prVar1,(const_iterator)position.m_node);
    operator_delete(p);
  }
  return;
}

Assistant:

void deallocate(T* p, std::size_t /* n */) NESTL_NOEXCEPT_SPEC
    {
        nestl::set<void*>::const_iterator pos = m_allocated_storage->find(p);
        if (pos == m_allocated_storage->end())
        {
            if (p)
            {
                fatal_failure("pointer [", static_cast<void*>(p), "] does not belong to this allocator");

                /**
                 * @note possible memory leak here, because we do not know how to deallocate
                 */
            }
        }
        else
        {
            m_allocated_storage->erase(pos);
            ::operator delete(p);
        }
    }